

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O0

int __thiscall
TPZSFMatrix<long_double>::Subst_Diag(TPZSFMatrix<long_double> *this,TPZFMatrix<long_double> *B)

{
  long lVar1;
  TPZBaseMatrix *pTVar2;
  int64_t iVar3;
  long lVar4;
  long lVar5;
  TPZBaseMatrix *in_RSI;
  long *in_RDI;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble lVar6;
  int64_t j;
  int64_t k;
  longdouble *pDiag;
  longdouble local_48;
  long local_30;
  long local_28;
  longdouble *local_20;
  TPZBaseMatrix *local_18;
  int local_4;
  
  local_18 = in_RSI;
  iVar3 = TPZBaseMatrix::Rows(in_RSI);
  lVar4 = (**(code **)(*in_RDI + 0x60))();
  if ((iVar3 == lVar4) && ((char)in_RDI[3] != '\0')) {
    local_20 = (longdouble *)in_RDI[4];
    local_28 = 0;
    while( true ) {
      lVar4 = local_28;
      lVar5 = (**(code **)(*in_RDI + 0x60))();
      if (lVar5 <= lVar4) break;
      local_30 = 0;
      while( true ) {
        lVar4 = local_30;
        iVar3 = TPZBaseMatrix::Cols(local_18);
        pTVar2 = local_18;
        lVar1 = local_28;
        lVar5 = local_30;
        if (iVar3 <= lVar4) break;
        (*(local_18->super_TPZSavable)._vptr_TPZSavable[0x24])();
        local_48 = in_ST0 / *local_20;
        lVar6 = in_ST6;
        (*(pTVar2->super_TPZSavable)._vptr_TPZSavable[0x23])(pTVar2,lVar1,lVar5,&local_48);
        local_30 = local_30 + 1;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = lVar6;
      }
      local_20 = local_20 + local_28 + 2;
      local_28 = local_28 + 1;
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
TPZSFMatrix<TVar> ::Subst_Diag( TPZFMatrix<TVar>  *B ) const
{
	if ( (B->Rows() != this->Dim()) || !this->fDecomposed )
		return( 0 );
	
	TVar *pDiag = fElem;
	for ( int64_t k = 0; k < this->Dim(); k++ )
    {
		for ( int64_t j = 0; j < B->Cols(); j++ )
			B->PutVal( k, j, B->GetVal( k, j ) / *pDiag );
		pDiag += (k + 2);
    }
	
	return( 1 );
}